

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O1

bool __thiscall duckdb::LineError::HandleErrors(LineError *this,StringValueResult *result)

{
  pointer pCVar1;
  CSVReaderOptions *pCVar2;
  idx_t iVar3;
  CSVReaderOptions *pCVar4;
  idx_t iVar5;
  idx_t iVar6;
  idx_t iVar7;
  LinesPerBoundary error_info;
  LinesPerBoundary error_info_00;
  byte bVar8;
  char cVar9;
  CSVFileScan *pCVar10;
  reference this_00;
  InvalidInputException *this_01;
  ulong uVar11;
  CurrentError *cur_error;
  pointer pCVar12;
  FullLinePosition *this_02;
  _Alloc_hider _Var13;
  pointer pCVar14;
  LinesPerBoundary error_info_01;
  LinesPerBoundary error_info_02;
  LinesPerBoundary error_info_03;
  LinesPerBoundary error_info_04;
  LinesPerBoundary error_info_05;
  LinesPerBoundary error_info_06;
  LinesPerBoundary error_info_07;
  LinesPerBoundary error_info_08;
  LinesPerBoundary error_info_09;
  optional_idx in_stack_fffffffffffffd68;
  undefined4 uVar15;
  string *psVar16;
  undefined7 uStack_288;
  bool first_nl;
  undefined8 local_280;
  idx_t local_278;
  optional_idx local_270;
  FullLinePosition *local_268;
  pointer local_260;
  LinesPerBoundary lines_per_batch;
  undefined1 local_230 [32];
  _Alloc_hider local_210;
  char local_200 [24];
  idx_t iStack_1e8;
  _Alloc_hider local_1e0;
  char local_1d0 [16];
  idx_t local_1c0;
  idx_t iStack_1b8;
  idx_t local_1b0;
  optional_idx oStack_1a8;
  string borked_line;
  CSVError csv_error;
  string column_name;
  optional_idx local_a8;
  optional_idx local_a0;
  optional_idx local_98;
  optional_idx local_90;
  optional_idx local_88;
  optional_idx local_80;
  optional_idx local_78;
  optional_idx local_70;
  optional_idx local_68;
  optional_idx local_60;
  string *local_58;
  idx_t iStack_50;
  _Alloc_hider local_48;
  idx_t iStack_40;
  
  pCVar1 = (this->current_errors).
           super_vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
           super__Vector_base<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar8 = 0;
  pCVar14 = (this->current_errors).
            super_vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
            super__Vector_base<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (pCVar12 = pCVar14; pCVar12 != pCVar1; pCVar12 = pCVar12 + 1) {
    if (pCVar12->type == INVALID_UNICODE) {
      bVar8 = 1;
    }
  }
  if ((((this->ignore_errors == false) && ((bVar8 & result->sniffing) == 0)) ||
      (this->is_error_in_line != true)) || (result->figure_out_new_line != false)) {
    if (pCVar14 != pCVar1) {
      this_02 = &result->current_line_position;
      local_270.index = (idx_t)&result->path;
      local_268 = this_02;
      do {
        uVar15 = (undefined4)(in_stack_fffffffffffffd68.index >> 0x20);
        LinesPerBoundary::LinesPerBoundary
                  (&lines_per_batch,(result->iterator->boundary).boundary_idx,*result->lines_read);
        first_nl = false;
        if ((result->super_ScannerResult).result_size == 1) {
          bVar8 = false;
        }
        else {
          pCVar2 = ((result->super_ScannerResult).state_machine)->options;
          bVar8 = true;
          if ((pCVar2->store_rejects).value == false) {
            bVar8 = (pCVar2->ignore_errors).value ^ 1;
          }
        }
        FullLinePosition::
        ReconstructCurrentLine<std::unordered_map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
                  (&borked_line,this_02,&first_nl,&result->buffer_handles,(bool)bVar8);
        psVar16 = (string *)0xd1dcdf;
        CSVError::CSVError(&csv_error);
        iVar7 = lines_per_batch.lines_in_batch;
        iVar6 = lines_per_batch.boundary_idx;
        if (INVALID_STATE < pCVar14->type) {
switchD_00d1dcff_caseD_1:
          this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_230._0_8_ = local_230 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_230,"CSV Error not allowed when inserting row","");
          InvalidInputException::InvalidInputException(this_01,(string *)local_230);
          __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error)
          ;
        }
        pCVar2 = (CSVReaderOptions *)pCVar14->col_idx;
        switch(pCVar14->type) {
        case CAST_ERROR:
          column_name._M_dataplus._M_p = (pointer)&column_name.field_2;
          column_name._M_string_length = 0;
          column_name.field_2._M_local_buf[0] = '\0';
          if (pCVar14->col_idx <
              (ulong)((long)(result->names).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(result->names).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5)) {
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ::operator[](&result->names,pCVar14->col_idx);
            ::std::__cxx11::string::_M_assign((string *)&column_name);
          }
          if (pCVar14->col_idx < (ulong)result->number_of_columns) {
            local_280 = (CSVReaderOptions *)
                        CONCAT44(local_280._4_4_,
                                 (int)CONCAT71((int7)(pCVar14->chunk_idx * 5 >> 8),
                                               *(LogicalTypeId *)
                                                ((long)((result->parse_types).
                                                                                                                
                                                  super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                                  ._M_t.
                                                  super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                                  .
                                                  super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>
                                                  ._M_head_impl + pCVar14->chunk_idx) + 1)));
          }
          else {
            local_280 = (CSVReaderOptions *)((ulong)local_280._4_4_ << 0x20);
          }
          local_278 = (this_02->begin).buffer_pos;
          if (((local_278 == (pCVar14->error_position).buffer_pos) &&
              ((result->current_line_position).begin.buffer_idx ==
               (pCVar14->error_position).buffer_idx)) &&
             ((result->current_line_position).begin.buffer_size ==
              (pCVar14->error_position).buffer_size)) {
            pCVar2 = ((result->super_ScannerResult).state_machine)->options;
            psVar16 = (string *)pCVar14->col_idx;
            local_48._M_p = (pointer)lines_per_batch.boundary_idx;
            iStack_40 = lines_per_batch.lines_in_batch;
            iVar6 = (result->current_line_position).begin.buffer_idx;
            iVar7 = result->requested_size;
            uVar11 = (ulong)first_nl;
            optional_idx::optional_idx
                      (&local_90,
                       (pCVar14->error_position).buffer_pos + uVar11 +
                       (pCVar14->error_position).buffer_idx * iVar7);
            in_stack_fffffffffffffd68.index._4_4_ = uVar15;
            in_stack_fffffffffffffd68.index._0_4_ = (uint)(byte)local_280;
            error_info.lines_in_batch = iVar6 * iVar7 + local_278 + uVar11;
            error_info.boundary_idx = iStack_40;
            CSVError::CastError((CSVError *)local_230,(CSVError *)pCVar2,
                                (CSVReaderOptions *)&column_name,&pCVar14->error_message,psVar16,
                                (idx_t)&borked_line,(string *)local_48._M_p,error_info,
                                local_90.index,in_stack_fffffffffffffd68,
                                (LogicalTypeId)local_270.index,
                                (string *)CONCAT17(first_nl,uStack_288));
            ::std::__cxx11::string::operator=((string *)&csv_error,(string *)local_230);
            ::std::__cxx11::string::operator=
                      ((string *)&csv_error.full_error_message,(string *)&local_210);
            csv_error.type = local_200[0x10];
            csv_error._65_1_ = local_200[0x11];
            csv_error._66_1_ = local_200[0x12];
            csv_error._67_1_ = local_200[0x13];
            csv_error._68_1_ = local_200[0x14];
            csv_error._69_1_ = local_200[0x15];
            csv_error._70_1_ = local_200[0x16];
            csv_error._71_1_ = local_200[0x17];
            csv_error.column_idx = iStack_1e8;
            ::std::__cxx11::string::operator=((string *)&csv_error.csv_row,(string *)&local_1e0);
            csv_error.row_byte_position = local_1b0;
            csv_error.byte_position.index = oStack_1a8.index;
            csv_error.error_info.boundary_idx = local_1c0;
            csv_error.error_info.lines_in_batch = iStack_1b8;
            if (local_1e0._M_p != local_1d0) {
              operator_delete(local_1e0._M_p);
            }
            this_02 = local_268;
            if (local_210._M_p != local_200) {
              operator_delete(local_210._M_p);
            }
            if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
LAB_00d1ed9a:
              operator_delete((void *)local_230._0_8_);
            }
          }
          else {
            pCVar2 = ((result->super_ScannerResult).state_machine)->options;
            psVar16 = (string *)pCVar14->col_idx;
            local_58 = (string *)lines_per_batch.boundary_idx;
            iStack_50 = lines_per_batch.lines_in_batch;
            iVar6 = (result->current_line_position).begin.buffer_idx;
            iVar7 = result->requested_size;
            uVar11 = (ulong)first_nl;
            optional_idx::optional_idx
                      (&local_98,
                       (pCVar14->error_position).buffer_idx * iVar7 +
                       (pCVar14->error_position).buffer_pos);
            in_stack_fffffffffffffd68.index._4_4_ = uVar15;
            in_stack_fffffffffffffd68.index._0_4_ = (uint)(byte)local_280;
            error_info_00.lines_in_batch = iVar6 * iVar7 + local_278 + uVar11;
            error_info_00.boundary_idx = iStack_50;
            CSVError::CastError((CSVError *)local_230,(CSVError *)pCVar2,
                                (CSVReaderOptions *)&column_name,&pCVar14->error_message,psVar16,
                                (idx_t)&borked_line,local_58,error_info_00,local_98.index,
                                in_stack_fffffffffffffd68,(LogicalTypeId)local_270.index,
                                (string *)CONCAT17(first_nl,uStack_288));
            ::std::__cxx11::string::operator=((string *)&csv_error,(string *)local_230);
            ::std::__cxx11::string::operator=
                      ((string *)&csv_error.full_error_message,(string *)&local_210);
            csv_error.type = local_200[0x10];
            csv_error._65_1_ = local_200[0x11];
            csv_error._66_1_ = local_200[0x12];
            csv_error._67_1_ = local_200[0x13];
            csv_error._68_1_ = local_200[0x14];
            csv_error._69_1_ = local_200[0x15];
            csv_error._70_1_ = local_200[0x16];
            csv_error._71_1_ = local_200[0x17];
            csv_error.column_idx = iStack_1e8;
            ::std::__cxx11::string::operator=((string *)&csv_error.csv_row,(string *)&local_1e0);
            csv_error.row_byte_position = local_1b0;
            csv_error.byte_position.index = oStack_1a8.index;
            csv_error.error_info.boundary_idx = local_1c0;
            csv_error.error_info.lines_in_batch = iStack_1b8;
            if (local_1e0._M_p != local_1d0) {
              operator_delete(local_1e0._M_p);
            }
            this_02 = local_268;
            if (local_210._M_p != local_200) {
              operator_delete(local_210._M_p);
            }
            if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) goto LAB_00d1ed9a;
          }
          _Var13._M_p = column_name._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)column_name._M_dataplus._M_p != &column_name.field_2) goto LAB_00d1edb4;
          break;
        default:
          goto switchD_00d1dcff_caseD_1;
        case TOO_FEW_COLUMNS:
        case TOO_MANY_COLUMNS:
          local_278 = (this_02->begin).buffer_pos;
          if (((local_278 == (pCVar14->error_position).buffer_pos) &&
              ((result->current_line_position).begin.buffer_idx ==
               (pCVar14->error_position).buffer_idx)) &&
             ((result->current_line_position).begin.buffer_size ==
              (pCVar14->error_position).buffer_size)) {
            iVar3 = (result->current_line_position).begin.buffer_idx;
            pCVar4 = ((result->super_ScannerResult).state_machine)->options;
            iVar5 = result->requested_size;
            uVar11 = (ulong)first_nl;
            psVar16 = (string *)0xd1dd8c;
            local_280 = pCVar2;
            optional_idx::optional_idx
                      (&local_60,
                       (pCVar14->error_position).buffer_pos + uVar11 +
                       (pCVar14->error_position).buffer_idx * iVar5);
            error_info_01.lines_in_batch = (idx_t)&borked_line;
            error_info_01.boundary_idx = iVar7;
            in_stack_fffffffffffffd68.index = local_270.index;
            CSVError::IncorrectColumnAmountError
                      ((CSVError *)local_230,(CSVError *)pCVar4,local_280,iVar6,error_info_01,
                       (string *)(iVar3 * iVar5 + local_278 + uVar11),local_60.index,local_270,
                       psVar16);
            ::std::__cxx11::string::operator=((string *)&csv_error,(string *)local_230);
            ::std::__cxx11::string::operator=
                      ((string *)&csv_error.full_error_message,(string *)&local_210);
            csv_error.type = local_200[0x10];
            csv_error._65_1_ = local_200[0x11];
            csv_error._66_1_ = local_200[0x12];
            csv_error._67_1_ = local_200[0x13];
            csv_error._68_1_ = local_200[0x14];
            csv_error._69_1_ = local_200[0x15];
            csv_error._70_1_ = local_200[0x16];
            csv_error._71_1_ = local_200[0x17];
            csv_error.column_idx = iStack_1e8;
            ::std::__cxx11::string::operator=((string *)&csv_error.csv_row,(string *)&local_1e0);
            csv_error.row_byte_position = local_1b0;
            csv_error.byte_position.index = oStack_1a8.index;
            csv_error.error_info.boundary_idx = local_1c0;
            csv_error.error_info.lines_in_batch = iStack_1b8;
            if (local_1e0._M_p != local_1d0) {
              operator_delete(local_1e0._M_p);
            }
            this_02 = local_268;
            if (local_210._M_p != local_200) {
              operator_delete(local_210._M_p);
            }
            _Var13._M_p = (pointer)local_230._0_8_;
            if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
LAB_00d1edb4:
              operator_delete(_Var13._M_p);
            }
          }
          else {
            iVar3 = (result->current_line_position).begin.buffer_idx;
            pCVar4 = ((result->super_ScannerResult).state_machine)->options;
            iVar5 = result->requested_size;
            uVar11 = (ulong)first_nl;
            psVar16 = (string *)0xd1dedc;
            local_280 = pCVar2;
            local_260 = pCVar14;
            optional_idx::optional_idx
                      (&local_68,
                       (pCVar14->error_position).buffer_idx * iVar5 +
                       (pCVar14->error_position).buffer_pos);
            error_info_02.lines_in_batch = (idx_t)&borked_line;
            error_info_02.boundary_idx = iVar7;
            in_stack_fffffffffffffd68.index = local_270.index;
            CSVError::IncorrectColumnAmountError
                      ((CSVError *)local_230,(CSVError *)pCVar4,local_280,iVar6,error_info_02,
                       (string *)(iVar3 * iVar5 + local_278 + uVar11),local_68.index,local_270,
                       psVar16);
            ::std::__cxx11::string::operator=((string *)&csv_error,(string *)local_230);
            ::std::__cxx11::string::operator=
                      ((string *)&csv_error.full_error_message,(string *)&local_210);
            csv_error.type = local_200[0x10];
            csv_error._65_1_ = local_200[0x11];
            csv_error._66_1_ = local_200[0x12];
            csv_error._67_1_ = local_200[0x13];
            csv_error._68_1_ = local_200[0x14];
            csv_error._69_1_ = local_200[0x15];
            csv_error._70_1_ = local_200[0x16];
            csv_error._71_1_ = local_200[0x17];
            csv_error.column_idx = iStack_1e8;
            ::std::__cxx11::string::operator=((string *)&csv_error.csv_row,(string *)&local_1e0);
            csv_error.row_byte_position = local_1b0;
            csv_error.byte_position.index = oStack_1a8.index;
            csv_error.error_info.boundary_idx = local_1c0;
            csv_error.error_info.lines_in_batch = iStack_1b8;
            if (local_1e0._M_p != local_1d0) {
              operator_delete(local_1e0._M_p);
            }
            pCVar14 = local_260;
            this_02 = local_268;
            if (local_210._M_p != local_200) {
              operator_delete(local_210._M_p);
            }
            _Var13._M_p = (pointer)local_230._0_8_;
            if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) goto LAB_00d1edb4;
          }
          break;
        case UNTERMINATED_QUOTES:
          local_278 = (this_02->begin).buffer_pos;
          if (((local_278 == (pCVar14->error_position).buffer_pos) &&
              ((result->current_line_position).begin.buffer_idx ==
               (pCVar14->error_position).buffer_idx)) &&
             ((result->current_line_position).begin.buffer_size ==
              (pCVar14->error_position).buffer_size)) {
            iVar3 = (result->current_line_position).begin.buffer_idx;
            pCVar4 = ((result->super_ScannerResult).state_machine)->options;
            iVar5 = result->requested_size;
            uVar11 = (ulong)first_nl;
            psVar16 = (string *)0xd1e521;
            local_280 = pCVar2;
            local_260 = pCVar14;
            optional_idx::optional_idx
                      (&local_80,
                       (pCVar14->error_position).buffer_pos + uVar11 +
                       (pCVar14->error_position).buffer_idx * iVar5);
            error_info_05.lines_in_batch = (idx_t)&borked_line;
            error_info_05.boundary_idx = iVar7;
            in_stack_fffffffffffffd68.index = local_270.index;
            CSVError::UnterminatedQuotesError
                      ((CSVError *)local_230,(CSVError *)pCVar4,local_280,iVar6,error_info_05,
                       (string *)(iVar3 * iVar5 + local_278 + uVar11),local_80.index,local_270,
                       psVar16);
            ::std::__cxx11::string::operator=((string *)&csv_error,(string *)local_230);
            ::std::__cxx11::string::operator=
                      ((string *)&csv_error.full_error_message,(string *)&local_210);
            csv_error.type = local_200[0x10];
            csv_error._65_1_ = local_200[0x11];
            csv_error._66_1_ = local_200[0x12];
            csv_error._67_1_ = local_200[0x13];
            csv_error._68_1_ = local_200[0x14];
            csv_error._69_1_ = local_200[0x15];
            csv_error._70_1_ = local_200[0x16];
            csv_error._71_1_ = local_200[0x17];
            csv_error.column_idx = iStack_1e8;
            ::std::__cxx11::string::operator=((string *)&csv_error.csv_row,(string *)&local_1e0);
            csv_error.row_byte_position = local_1b0;
            csv_error.byte_position.index = oStack_1a8.index;
            csv_error.error_info.boundary_idx = local_1c0;
            csv_error.error_info.lines_in_batch = iStack_1b8;
            if (local_1e0._M_p != local_1d0) {
              operator_delete(local_1e0._M_p);
            }
            pCVar14 = local_260;
            this_02 = local_268;
            if (local_210._M_p != local_200) {
              operator_delete(local_210._M_p);
            }
            _Var13._M_p = (pointer)local_230._0_8_;
            if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) goto LAB_00d1edb4;
          }
          else {
            iVar3 = (result->current_line_position).begin.buffer_idx;
            pCVar4 = ((result->super_ScannerResult).state_machine)->options;
            iVar5 = result->requested_size;
            uVar11 = (ulong)first_nl;
            psVar16 = (string *)0xd1e95e;
            local_280 = pCVar2;
            local_260 = pCVar14;
            optional_idx::optional_idx
                      (&local_88,
                       (pCVar14->error_position).buffer_idx * iVar5 +
                       (pCVar14->error_position).buffer_pos);
            error_info_08.lines_in_batch = (idx_t)&borked_line;
            error_info_08.boundary_idx = iVar7;
            in_stack_fffffffffffffd68.index = local_270.index;
            CSVError::UnterminatedQuotesError
                      ((CSVError *)local_230,(CSVError *)pCVar4,local_280,iVar6,error_info_08,
                       (string *)(iVar3 * iVar5 + local_278 + uVar11),local_88.index,local_270,
                       psVar16);
            ::std::__cxx11::string::operator=((string *)&csv_error,(string *)local_230);
            ::std::__cxx11::string::operator=
                      ((string *)&csv_error.full_error_message,(string *)&local_210);
            csv_error.type = local_200[0x10];
            csv_error._65_1_ = local_200[0x11];
            csv_error._66_1_ = local_200[0x12];
            csv_error._67_1_ = local_200[0x13];
            csv_error._68_1_ = local_200[0x14];
            csv_error._69_1_ = local_200[0x15];
            csv_error._70_1_ = local_200[0x16];
            csv_error._71_1_ = local_200[0x17];
            csv_error.column_idx = iStack_1e8;
            ::std::__cxx11::string::operator=((string *)&csv_error.csv_row,(string *)&local_1e0);
            csv_error.row_byte_position = local_1b0;
            csv_error.byte_position.index = oStack_1a8.index;
            csv_error.error_info.boundary_idx = local_1c0;
            csv_error.error_info.lines_in_batch = iStack_1b8;
            if (local_1e0._M_p != local_1d0) {
              operator_delete(local_1e0._M_p);
            }
            pCVar14 = local_260;
            this_02 = local_268;
            if (local_210._M_p != local_200) {
              operator_delete(local_210._M_p);
            }
            _Var13._M_p = (pointer)local_230._0_8_;
            if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) goto LAB_00d1edb4;
          }
          break;
        case MAXIMUM_LINE_SIZE:
          error_info_09.lines_in_batch = (idx_t)&borked_line;
          error_info_09.boundary_idx = lines_per_batch.lines_in_batch;
          in_stack_fffffffffffffd68.index = local_270.index;
          CSVError::LineSizeError
                    ((CSVError *)local_230,
                     (CSVError *)((result->super_ScannerResult).state_machine)->options,
                     (CSVReaderOptions *)lines_per_batch.boundary_idx,error_info_09,
                     (string *)
                     ((ulong)first_nl + (result->current_line_position).begin.buffer_pos +
                     (result->current_line_position).begin.buffer_idx * result->requested_size),
                     local_270.index,psVar16);
          ::std::__cxx11::string::operator=((string *)&csv_error,(string *)local_230);
          ::std::__cxx11::string::operator=
                    ((string *)&csv_error.full_error_message,(string *)&local_210);
          csv_error.type = local_200[0x10];
          csv_error._65_1_ = local_200[0x11];
          csv_error._66_1_ = local_200[0x12];
          csv_error._67_1_ = local_200[0x13];
          csv_error._68_1_ = local_200[0x14];
          csv_error._69_1_ = local_200[0x15];
          csv_error._70_1_ = local_200[0x16];
          csv_error._71_1_ = local_200[0x17];
          csv_error.column_idx = iStack_1e8;
          ::std::__cxx11::string::operator=((string *)&csv_error.csv_row,(string *)&local_1e0);
          csv_error.row_byte_position = local_1b0;
          csv_error.byte_position.index = oStack_1a8.index;
          csv_error.error_info.boundary_idx = local_1c0;
          csv_error.error_info.lines_in_batch = iStack_1b8;
          if (local_1e0._M_p != local_1d0) {
            operator_delete(local_1e0._M_p);
          }
          if (local_210._M_p != local_200) {
            operator_delete(local_210._M_p);
          }
          _Var13._M_p = (pointer)local_230._0_8_;
          if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) goto LAB_00d1edb4;
          break;
        case INVALID_UNICODE:
          local_278 = (this_02->begin).buffer_pos;
          if (((local_278 == (pCVar14->error_position).buffer_pos) &&
              ((result->current_line_position).begin.buffer_idx ==
               (pCVar14->error_position).buffer_idx)) &&
             ((result->current_line_position).begin.buffer_size ==
              (pCVar14->error_position).buffer_size)) {
            iVar3 = (result->current_line_position).begin.buffer_idx;
            pCVar4 = ((result->super_ScannerResult).state_machine)->options;
            iVar5 = result->requested_size;
            uVar11 = (ulong)first_nl;
            psVar16 = (string *)0xd1e072;
            local_280 = pCVar2;
            local_260 = pCVar14;
            optional_idx::optional_idx
                      (&local_70,
                       (pCVar14->error_position).buffer_pos + uVar11 +
                       (pCVar14->error_position).buffer_idx * iVar5);
            error_info_03.lines_in_batch = (idx_t)&borked_line;
            error_info_03.boundary_idx = iVar7;
            in_stack_fffffffffffffd68.index = local_270.index;
            CSVError::InvalidUTF8
                      ((CSVError *)local_230,(CSVError *)pCVar4,local_280,iVar6,error_info_03,
                       (string *)(iVar3 * iVar5 + local_278 + uVar11),local_70.index,local_270,
                       psVar16);
            ::std::__cxx11::string::operator=((string *)&csv_error,(string *)local_230);
            ::std::__cxx11::string::operator=
                      ((string *)&csv_error.full_error_message,(string *)&local_210);
            csv_error.type = local_200[0x10];
            csv_error._65_1_ = local_200[0x11];
            csv_error._66_1_ = local_200[0x12];
            csv_error._67_1_ = local_200[0x13];
            csv_error._68_1_ = local_200[0x14];
            csv_error._69_1_ = local_200[0x15];
            csv_error._70_1_ = local_200[0x16];
            csv_error._71_1_ = local_200[0x17];
            csv_error.column_idx = iStack_1e8;
            ::std::__cxx11::string::operator=((string *)&csv_error.csv_row,(string *)&local_1e0);
            csv_error.row_byte_position = local_1b0;
            csv_error.byte_position.index = oStack_1a8.index;
            csv_error.error_info.boundary_idx = local_1c0;
            csv_error.error_info.lines_in_batch = iStack_1b8;
            if (local_1e0._M_p != local_1d0) {
              operator_delete(local_1e0._M_p);
            }
            pCVar14 = local_260;
            this_02 = local_268;
            if (local_210._M_p != local_200) {
              operator_delete(local_210._M_p);
            }
            if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
LAB_00d1e76f:
              operator_delete((void *)local_230._0_8_);
            }
          }
          else {
            iVar3 = (result->current_line_position).begin.buffer_idx;
            pCVar4 = ((result->super_ScannerResult).state_machine)->options;
            iVar5 = result->requested_size;
            uVar11 = (ulong)first_nl;
            psVar16 = (string *)0xd1e66c;
            local_280 = pCVar2;
            local_260 = pCVar14;
            optional_idx::optional_idx
                      (&local_78,
                       (pCVar14->error_position).buffer_idx * iVar5 +
                       (pCVar14->error_position).buffer_pos);
            error_info_06.lines_in_batch = (idx_t)&borked_line;
            error_info_06.boundary_idx = iVar7;
            in_stack_fffffffffffffd68.index = local_270.index;
            CSVError::InvalidUTF8
                      ((CSVError *)local_230,(CSVError *)pCVar4,local_280,iVar6,error_info_06,
                       (string *)(iVar3 * iVar5 + local_278 + uVar11),local_78.index,local_270,
                       psVar16);
            ::std::__cxx11::string::operator=((string *)&csv_error,(string *)local_230);
            ::std::__cxx11::string::operator=
                      ((string *)&csv_error.full_error_message,(string *)&local_210);
            csv_error.type = local_200[0x10];
            csv_error._65_1_ = local_200[0x11];
            csv_error._66_1_ = local_200[0x12];
            csv_error._67_1_ = local_200[0x13];
            csv_error._68_1_ = local_200[0x14];
            csv_error._69_1_ = local_200[0x15];
            csv_error._70_1_ = local_200[0x16];
            csv_error._71_1_ = local_200[0x17];
            csv_error.column_idx = iStack_1e8;
            ::std::__cxx11::string::operator=((string *)&csv_error.csv_row,(string *)&local_1e0);
            csv_error.row_byte_position = local_1b0;
            csv_error.byte_position.index = oStack_1a8.index;
            csv_error.error_info.boundary_idx = local_1c0;
            csv_error.error_info.lines_in_batch = iStack_1b8;
            if (local_1e0._M_p != local_1d0) {
              operator_delete(local_1e0._M_p);
            }
            pCVar14 = local_260;
            this_02 = local_268;
            if (local_210._M_p != local_200) {
              operator_delete(local_210._M_p);
            }
            if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) goto LAB_00d1e76f;
          }
          pCVar10 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(&result->csv_file_scan);
          this_00 = vector<duckdb::LogicalType,_true>::operator[]
                              (&pCVar10->file_types,(size_type)local_280);
          uVar11 = (ulong)this_00->id_;
          if (uVar11 < 0x21) {
            if ((0xf0e9fc00UL >> (uVar11 & 0x3f) & 1) == 0) {
              if (uVar11 == 0x19) {
                cVar9 = LogicalType::IsJSONType(this_00);
              }
              else {
                if (uVar11 != 0x20) goto LAB_00d1ee51;
                cVar9 = result->icu_loaded;
              }
              if (cVar9 != '\0') goto LAB_00d1ee51;
            }
          }
          else {
LAB_00d1ee51:
            result->number_of_rows = result->number_of_rows + -1;
          }
          break;
        case INVALID_STATE:
          local_278 = (this_02->begin).buffer_pos;
          if (((local_278 == (pCVar14->error_position).buffer_pos) &&
              ((result->current_line_position).begin.buffer_idx ==
               (pCVar14->error_position).buffer_idx)) &&
             ((result->current_line_position).begin.buffer_size ==
              (pCVar14->error_position).buffer_size)) {
            iVar3 = (result->current_line_position).begin.buffer_idx;
            pCVar4 = ((result->super_ScannerResult).state_machine)->options;
            iVar5 = result->requested_size;
            uVar11 = (ulong)first_nl;
            psVar16 = (string *)0xd1e28f;
            local_280 = pCVar2;
            local_260 = pCVar14;
            optional_idx::optional_idx
                      (&local_a0,
                       (pCVar14->error_position).buffer_pos + uVar11 +
                       (pCVar14->error_position).buffer_idx * iVar5);
            error_info_04.lines_in_batch = (idx_t)&borked_line;
            error_info_04.boundary_idx = iVar7;
            in_stack_fffffffffffffd68.index = local_270.index;
            CSVError::InvalidState
                      ((CSVError *)local_230,(CSVError *)pCVar4,local_280,iVar6,error_info_04,
                       (string *)(iVar3 * iVar5 + local_278 + uVar11),local_a0.index,local_270,
                       psVar16);
            ::std::__cxx11::string::operator=((string *)&csv_error,(string *)local_230);
            ::std::__cxx11::string::operator=
                      ((string *)&csv_error.full_error_message,(string *)&local_210);
            csv_error.type = local_200[0x10];
            csv_error._65_1_ = local_200[0x11];
            csv_error._66_1_ = local_200[0x12];
            csv_error._67_1_ = local_200[0x13];
            csv_error._68_1_ = local_200[0x14];
            csv_error._69_1_ = local_200[0x15];
            csv_error._70_1_ = local_200[0x16];
            csv_error._71_1_ = local_200[0x17];
            csv_error.column_idx = iStack_1e8;
            ::std::__cxx11::string::operator=((string *)&csv_error.csv_row,(string *)&local_1e0);
            csv_error.row_byte_position = local_1b0;
            csv_error.byte_position.index = oStack_1a8.index;
            csv_error.error_info.boundary_idx = local_1c0;
            csv_error.error_info.lines_in_batch = iStack_1b8;
            if (local_1e0._M_p != local_1d0) {
              operator_delete(local_1e0._M_p);
            }
            pCVar14 = local_260;
            this_02 = local_268;
            if (local_210._M_p != local_200) {
              operator_delete(local_210._M_p);
            }
            _Var13._M_p = (pointer)local_230._0_8_;
            if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) goto LAB_00d1edb4;
          }
          else {
            iVar3 = (result->current_line_position).begin.buffer_idx;
            pCVar4 = ((result->super_ScannerResult).state_machine)->options;
            iVar5 = result->requested_size;
            uVar11 = (ulong)first_nl;
            psVar16 = (string *)0xd1e812;
            local_280 = pCVar2;
            local_260 = pCVar14;
            optional_idx::optional_idx
                      (&local_a8,
                       (pCVar14->error_position).buffer_idx * iVar5 +
                       (pCVar14->error_position).buffer_pos);
            error_info_07.lines_in_batch = (idx_t)&borked_line;
            error_info_07.boundary_idx = iVar7;
            in_stack_fffffffffffffd68.index = local_270.index;
            CSVError::InvalidState
                      ((CSVError *)local_230,(CSVError *)pCVar4,local_280,iVar6,error_info_07,
                       (string *)(iVar3 * iVar5 + local_278 + uVar11),local_a8.index,local_270,
                       psVar16);
            ::std::__cxx11::string::operator=((string *)&csv_error,(string *)local_230);
            ::std::__cxx11::string::operator=
                      ((string *)&csv_error.full_error_message,(string *)&local_210);
            csv_error.type = local_200[0x10];
            csv_error._65_1_ = local_200[0x11];
            csv_error._66_1_ = local_200[0x12];
            csv_error._67_1_ = local_200[0x13];
            csv_error._68_1_ = local_200[0x14];
            csv_error._69_1_ = local_200[0x15];
            csv_error._70_1_ = local_200[0x16];
            csv_error._71_1_ = local_200[0x17];
            csv_error.column_idx = iStack_1e8;
            ::std::__cxx11::string::operator=((string *)&csv_error.csv_row,(string *)&local_1e0);
            csv_error.row_byte_position = local_1b0;
            csv_error.byte_position.index = oStack_1a8.index;
            csv_error.error_info.boundary_idx = local_1c0;
            csv_error.error_info.lines_in_batch = iStack_1b8;
            if (local_1e0._M_p != local_1d0) {
              operator_delete(local_1e0._M_p);
            }
            pCVar14 = local_260;
            this_02 = local_268;
            if (local_210._M_p != local_200) {
              operator_delete(local_210._M_p);
            }
            _Var13._M_p = (pointer)local_230._0_8_;
            if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) goto LAB_00d1edb4;
          }
        }
        CSVErrorHandler::Error(result->error_handler,&csv_error,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)csv_error.csv_row._M_dataplus._M_p != &csv_error.csv_row.field_2) {
          operator_delete(csv_error.csv_row._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)csv_error.full_error_message._M_dataplus._M_p !=
            &csv_error.full_error_message.field_2) {
          operator_delete(csv_error.full_error_message._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)csv_error.error_message._M_dataplus._M_p != &csv_error.error_message.field_2) {
          operator_delete(csv_error.error_message._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)borked_line._M_dataplus._M_p != &borked_line.field_2) {
          operator_delete(borked_line._M_dataplus._M_p);
        }
        pCVar14 = pCVar14 + 1;
      } while (pCVar14 != pCVar1);
    }
    if (this->is_error_in_line != true) {
      return false;
    }
    if (this->scan_id == 0xffffffffffffffff) {
      return false;
    }
    if (result->sniffing != true) {
      csv_error.error_message._M_dataplus._M_p = (pointer)&result->borked_rows;
      local_230._0_8_ = result->number_of_rows;
      ::std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ();
      result->cur_col_id = 0;
      result->chunk_col_id = 0;
      goto LAB_00d1eec0;
    }
  }
  StringValueResult::RemoveLastLine(result);
LAB_00d1eec0:
  ::std::vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>::clear
            ((vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_> *)this);
  this->is_error_in_line = false;
  return true;
}

Assistant:

bool LineError::HandleErrors(StringValueResult &result) {
	bool skip_sniffing = false;
	for (auto &cur_error : current_errors) {
		if (cur_error.type == CSVErrorType::INVALID_UNICODE) {
			skip_sniffing = true;
		}
	}
	skip_sniffing = result.sniffing && skip_sniffing;

	if ((ignore_errors || skip_sniffing) && is_error_in_line && !result.figure_out_new_line) {
		result.RemoveLastLine();
		Reset();
		return true;
	}
	// Reconstruct CSV Line
	for (auto &cur_error : current_errors) {
		LinesPerBoundary lines_per_batch(result.iterator.GetBoundaryIdx(), result.lines_read);
		bool first_nl = false;
		auto borked_line = result.current_line_position.ReconstructCurrentLine(first_nl, result.buffer_handles,
		                                                                       result.PrintErrorLine());
		CSVError csv_error;
		auto col_idx = cur_error.col_idx;
		auto &line_pos = cur_error.error_position;

		switch (cur_error.type) {
		case TOO_MANY_COLUMNS:
		case TOO_FEW_COLUMNS:
			if (result.current_line_position.begin == line_pos) {
				csv_error = CSVError::IncorrectColumnAmountError(
				    result.state_machine.options, col_idx, lines_per_batch, borked_line,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size, first_nl), result.path);
			} else {
				csv_error = CSVError::IncorrectColumnAmountError(
				    result.state_machine.options, col_idx, lines_per_batch, borked_line,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size), result.path);
			}
			break;
		case INVALID_UNICODE: {
			if (result.current_line_position.begin == line_pos) {
				csv_error = CSVError::InvalidUTF8(
				    result.state_machine.options, col_idx, lines_per_batch, borked_line,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size, first_nl), result.path);
			} else {
				csv_error = CSVError::InvalidUTF8(
				    result.state_machine.options, col_idx, lines_per_batch, borked_line,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size), result.path);
			}
			if (!StringValueScanner::CanDirectlyCast(result.csv_file_scan->file_types[col_idx], result.icu_loaded)) {
				result.number_of_rows--;
			}
			break;
		}
		case UNTERMINATED_QUOTES:
			if (result.current_line_position.begin == line_pos) {
				csv_error = CSVError::UnterminatedQuotesError(
				    result.state_machine.options, col_idx, lines_per_batch, borked_line,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size, first_nl), result.path);
			} else {
				csv_error = CSVError::UnterminatedQuotesError(
				    result.state_machine.options, col_idx, lines_per_batch, borked_line,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size), result.path);
			}
			break;
		case CAST_ERROR: {
			string column_name;
			LogicalTypeId type_id = LogicalTypeId::INVALID;
			if (cur_error.col_idx < result.names.size()) {
				column_name = result.names[cur_error.col_idx];
			}
			if (cur_error.col_idx < result.number_of_columns) {
				type_id = result.parse_types[cur_error.chunk_idx].type_id;
			}
			if (result.current_line_position.begin == line_pos) {
				csv_error = CSVError::CastError(
				    result.state_machine.options, column_name, cur_error.error_message, cur_error.col_idx, borked_line,
				    lines_per_batch,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size, first_nl), type_id, result.path);
			} else {
				csv_error = CSVError::CastError(
				    result.state_machine.options, column_name, cur_error.error_message, cur_error.col_idx, borked_line,
				    lines_per_batch,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size), type_id, result.path);
			}
		} break;
		case MAXIMUM_LINE_SIZE:
			csv_error = CSVError::LineSizeError(
			    result.state_machine.options, lines_per_batch, borked_line,
			    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl), result.path);
			break;
		case INVALID_STATE:
			if (result.current_line_position.begin == line_pos) {
				csv_error = CSVError::InvalidState(
				    result.state_machine.options, col_idx, lines_per_batch, borked_line,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size, first_nl), result.path);
			} else {
				csv_error = CSVError::InvalidState(
				    result.state_machine.options, col_idx, lines_per_batch, borked_line,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size), result.path);
			}
			break;
		default:
			throw InvalidInputException("CSV Error not allowed when inserting row");
		}
		result.error_handler.Error(csv_error);
	}
	if (is_error_in_line && scan_id != StringValueScanner::LINE_FINDER_ID) {
		if (result.sniffing) {
			// If we are sniffing we just remove the line
			result.RemoveLastLine();
		} else {
			// Otherwise, we add it to the borked rows to remove it later and just cleanup the column variables.
			result.borked_rows.insert(static_cast<idx_t>(result.number_of_rows));
			result.cur_col_id = 0;
			result.chunk_col_id = 0;
		}
		Reset();
		return true;
	}
	return false;
}